

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O3

void setup_one_ghash_entry(ptls_fusion_aesgcm_context_t *ctx)

{
  ulong uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint *puVar10;
  undefined1 (*pauVar11) [16];
  ptls_fusion_aesgcm_context_t *ppVar12;
  ulong *puVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  ppVar12 = ctx + 1;
  uVar1 = ctx->ghash_cnt;
  if ((ctx->ecb).aesni256 == '\0') {
    lVar15 = uVar1 * 0x20;
    pauVar11 = (undefined1 (*) [16])((long)&(ppVar12->ecb).keys + lVar15);
    puVar10 = (uint *)((long)&(ppVar12->ecb).keys + lVar15 + 0x10);
    if (uVar1 == 0) goto LAB_00119e24;
    puVar13 = (ulong *)((long)ppVar12 + lVar15 + -0x20);
  }
  else {
    uVar14 = (ulong)((~(uint)uVar1 & 1) << 4);
    pauVar11 = (undefined1 (*) [16])
               ((long)&(ppVar12->ecb).keys + uVar14 + (uVar1 & 0x7fffffffffffffe) * 0x20);
    puVar10 = (uint *)((long)&(ppVar12->ecb).keys +
                      uVar14 + (uVar1 & 0x7fffffffffffffe) * 0x20 + 0x20);
    if (uVar1 == 0) goto LAB_00119e24;
    puVar13 = (ulong *)((long)&(ppVar12->ecb).keys +
                       (ulong)((~(uint)(uVar1 - 1) & 1) << 4) +
                       (uVar1 - 1 & 0x7fffffffffffffe) * 0x20);
    ppVar12 = (ptls_fusion_aesgcm_context_t *)(ctx[1].ecb.keys.m128 + 1);
  }
  uVar1 = (ppVar12->ecb).keys.m128[0][0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *puVar13;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar4 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ auVar6 << uVar2;
    }
  }
  auVar16._8_8_ = 0;
  auVar16._0_8_ = puVar13[1];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (ppVar12->ecb).keys.m128[0][1];
  auVar4 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar16 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar4 = auVar4 ^ auVar17 << uVar2;
    }
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *puVar13 ^ puVar13[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1 ^ (ppVar12->ecb).keys.m128[0][1];
  auVar6 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar6 = auVar6 ^ auVar7 << uVar2;
    }
  }
  auVar6 = auVar3 ^ auVar4 ^ auVar6;
  auVar17 = vpslldq_avx(auVar6,8);
  auVar16 = vpsrldq_avx(auVar6,8);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SUB168(auVar3 ^ auVar17,0);
  auVar6 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar8 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar6 = auVar6 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar3 ^ auVar17,0x4e);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SUB168(auVar6 ^ auVar3,0);
  auVar17 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar9 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar17 = auVar17 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar6 ^ auVar3,0x4e);
  *pauVar11 = auVar17 ^ auVar16 ^ auVar3 ^ auVar4;
LAB_00119e24:
  auVar3 = *pauVar11;
  auVar4 = vshufps_avx(auVar3,auVar3,0x4e);
  *puVar10 = auVar4._0_4_ ^ auVar3._0_4_;
  puVar10[1] = auVar4._4_4_ ^ auVar3._4_4_;
  puVar10[2] = auVar4._8_4_ ^ auVar3._8_4_;
  puVar10[3] = auVar4._12_4_ ^ auVar3._12_4_;
  ctx->ghash_cnt = ctx->ghash_cnt + 1;
  return;
}

Assistant:

static void setup_one_ghash_entry(ptls_fusion_aesgcm_context_t *ctx)
{
    __m128i *H, *r, *Hprev, H0;

    if (ctx->ecb.aesni256) {
        struct ptls_fusion_aesgcm_context256 *ctx256 = (void *)ctx;
#define GET_SLOT(i, mem) (&ctx256->ghash[(i) / 2].mem[(i) % 2 == 0])
        H = GET_SLOT(ctx->ghash_cnt, H);
        r = GET_SLOT(ctx->ghash_cnt, r);
        Hprev = ctx->ghash_cnt == 0 ? NULL : GET_SLOT(ctx->ghash_cnt - 1, H);
#undef GET_SLOT
        H0 = ctx256->ghash[0].H[1];
    } else {
        struct ptls_fusion_aesgcm_context128 *ctx128 = (void *)ctx;
        H = &ctx128->ghash[ctx->ghash_cnt].H;
        r = &ctx128->ghash[ctx->ghash_cnt].r;
        Hprev = ctx->ghash_cnt == 0 ? NULL : &ctx128->ghash[ctx->ghash_cnt - 1].H;
        H0 = ctx128->ghash[0].H;
    }

    if (Hprev != NULL)
        *H = gfmul(*Hprev, H0);

    *r = _mm_shuffle_epi32(*H, 78);
    *r = _mm_xor_si128(*r, *H);

    ++ctx->ghash_cnt;
}